

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

void __thiscall
helics::TimeCoordinator::enteringExecMode(TimeCoordinator *this,IterationRequest mode)

{
  TimeDependencies *this_00;
  int iVar1;
  DependencyInfo *pDVar2;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  ActionMessage execreq;
  
  if ((this->super_BaseTimeCoordinator).executionMode == false) {
    this->iterating = mode;
    this_00 = &(this->super_BaseTimeCoordinator).dependencies;
    TimeDependencies::checkForIssues_abi_cxx11_
              (&res,this_00,(this->info).wait_for_current_time_updates);
    if (res.first == 0) {
      BaseTimeCoordinator::sendTimingInfo(&this->super_BaseTimeCoordinator);
      (this->super_BaseTimeCoordinator).checkingExec = true;
      ActionMessage::ActionMessage(&execreq,cmd_exec_request);
      execreq.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      if (this->iterating != NO_ITERATIONS) {
        setIterationFlags(&execreq,this->iterating);
        iVar1 = (this->super_BaseTimeCoordinator).sequenceCounter + 1;
        (this->super_BaseTimeCoordinator).sequenceCounter = iVar1;
        execreq.counter = (uint16_t)iVar1;
        if (this->hasInitUpdates == false) {
          pDVar2 = getExecEntryMinFederate
                             (this_00,(GlobalFederateId)
                                      (this->super_BaseTimeCoordinator).mSourceId.gid,NONE,
                              (GlobalFederateId)0x8831d580);
          execreq.dest_handle.hid = (pDVar2->fedID).gid;
        }
      }
      if ((this->info).wait_for_current_time_updates == true) {
        execreq.flags._1_1_ = execreq.flags._1_1_ | 4;
      }
      transmitTimingMessages(this,&execreq,(GlobalFederateId)0x8831d580);
    }
    else {
      ActionMessage::ActionMessage(&execreq,cmd_global_error);
      execreq.dest_id.gid = 0;
      execreq.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      execreq.messageID = res.first;
      SmallBuffer::operator=(&execreq.payload,&res.second);
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                (&(this->super_BaseTimeCoordinator).sendMessageFunction,&execreq);
    }
    ActionMessage::~ActionMessage(&execreq);
    std::__cxx11::string::~string((string *)&res.second);
  }
  return;
}

Assistant:

void TimeCoordinator::enteringExecMode(IterationRequest mode)
{
    if (executionMode) {
        return;
    }
    iterating = mode;
    auto res = dependencies.checkForIssues(info.wait_for_current_time_updates);
    if (res.first != 0) {
        ActionMessage ge(CMD_GLOBAL_ERROR);
        ge.dest_id = parent_broker_id;
        ge.source_id = mSourceId;
        ge.messageID = res.first;
        ge.payload = res.second;
        sendMessageFunction(ge);
        return;
    }
    sendTimingInfo();
    checkingExec = true;
    ActionMessage execreq(CMD_EXEC_REQUEST);

    execreq.source_id = mSourceId;
    if (iterating != IterationRequest::NO_ITERATIONS) {
        setIterationFlags(execreq, iterating);
        ++sequenceCounter;
        execreq.counter = sequenceCounter;
        if (!hasInitUpdates) {
            const auto& mfed = getExecEntryMinFederate(dependencies, mSourceId);
            execreq.setExtraData(mfed.fedID.baseValue());
        }
    }
    if (info.wait_for_current_time_updates) {
        setActionFlag(execreq, delayed_timing_flag);
    }
    transmitTimingMessages(execreq);
}